

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

PNode * find_PNode(Parser *p,char *start,char *end_skip,int symbol,D_Scope *sc,uint *hash)

{
  PNode *pPVar1;
  uint uVar2;
  uint32 uVar3;
  PNode *_t;
  PNode *t;
  PNode *result;
  PNode *pPStack_48;
  uint h;
  PNode *pn;
  PNodeHash *ph;
  uint *hash_local;
  D_Scope *sc_local;
  int symbol_local;
  char *end_skip_local;
  char *start_local;
  Parser *p_local;
  
  uVar2 = (int)((long)start << 8) + (int)((long)end_skip << 0x10) + symbol + (int)sc;
  *hash = uVar2;
  t = (PNode *)0x0;
  if ((p->pnode_hash).v != (PNode **)0x0) {
    for (pPStack_48 = (p->pnode_hash).v[(ulong)uVar2 % (ulong)(p->pnode_hash).m];
        pPStack_48 != (PNode *)0x0; pPStack_48 = pPStack_48->bucket_next) {
      pPVar1 = t;
      if ((((pPStack_48->hash == uVar2) && ((pPStack_48->parse_node).symbol == symbol)) &&
          ((pPStack_48->parse_node).start_loc.s == start)) &&
         (((pPStack_48->parse_node).end_skip == end_skip && (pPStack_48->initial_scope == sc)))) {
        while (pPStack_48->latest != pPStack_48->latest->latest) {
          pPVar1 = pPStack_48->latest->latest;
          pPVar1->refcount = pPVar1->refcount + 1;
          uVar3 = pPStack_48->latest->refcount - 1;
          pPStack_48->latest->refcount = uVar3;
          if (uVar3 == 0) {
            free_PNode(p,pPStack_48->latest);
          }
          pPStack_48->latest = pPVar1;
        }
        pPVar1 = pPStack_48->latest;
        if ((t != (PNode *)0x0) && (t != pPVar1)) {
          __assert_fail("!result || result == t",
                        "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/parse.c"
                        ,0x135,"PNode *find_PNode(Parser *, char *, char *, int, D_Scope *, uint *)"
                       );
        }
      }
      t = pPVar1;
    }
  }
  return t;
}

Assistant:

PNode *find_PNode(Parser *p, char *start, char *end_skip, int symbol, D_Scope *sc, uint *hash) {
  PNodeHash *ph = &p->pnode_hash;
  PNode *pn;
  uint h = PNODE_HASH(start, end_skip, symbol, sc);
  *hash = h;
  PNode *result = NULL;
  if (ph->v)
    for (pn = ph->v[h % ph->m]; pn; pn = pn->bucket_next)
      if (pn->hash == h && pn->parse_node.symbol == symbol && pn->parse_node.start_loc.s == start &&
          pn->parse_node.end_skip == end_skip && pn->initial_scope == sc) {
        PNode *t = pn;
        LATEST(p, t);
        assert(!result  || result == t);
        result = t;
      }
  return result;
}